

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

Node * __thiscall Fl_Preferences::Node::search(Node *this,char *path,int offset)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  size_t sVar4;
  Node *nn_1;
  Node *nd;
  Node *pNStack_30;
  int len;
  Node *nn;
  int offset_local;
  char *path_local;
  Node *this_local;
  
  nn._4_4_ = offset;
  if (offset == 0) {
    if (*path == '.') {
      if (path[1] == '\0') {
        return this;
      }
      pNStack_30 = this;
      if (path[1] == '/') {
        while (pNVar3 = parent(pNStack_30), pNVar3 != (Node *)0x0) {
          pNStack_30 = parent(pNStack_30);
        }
        if (path[2] == '\0') {
          return pNStack_30;
        }
        pNVar3 = search(pNStack_30,path + 2,2);
        return pNVar3;
      }
    }
    sVar4 = strlen(this->path_);
    nn._4_4_ = (int)sVar4 + 1;
  }
  sVar4 = strlen(this->path_);
  if ((int)sVar4 < nn._4_4_ + -1) {
    return (Node *)0x0;
  }
  iVar1 = (int)sVar4 - nn._4_4_;
  if ((iVar1 < 1) || (iVar2 = strncmp(path,this->path_ + nn._4_4_,(long)iVar1), iVar2 == 0)) {
    if ((0 < iVar1) && (path[iVar1] == '\0')) {
      return this;
    }
    if ((iVar1 < 1) || (path[iVar1] == '/')) {
      nn_1 = this->child_;
      while( true ) {
        if (nn_1 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar3 = search(nn_1,path,nn._4_4_);
        if (pNVar3 != (Node *)0x0) break;
        nn_1 = nn_1->next_;
      }
      return pNVar3;
    }
  }
  return (Node *)0x0;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::search( const char *path, int offset ) { 
  if ( offset == 0 ) {
    if ( path[0] == '.' ) {
      if ( path[1] == 0 ) {
	return this; // user was searching for current node
      } else if ( path[1] == '/' ) {
	Node *nn = this;
	while ( nn->parent() ) nn = nn->parent();
	if ( path[2]==0 ) {		// user is searching for root ( "./" )
	  return nn;
	}
	return nn->search( path+2, 2 ); // do a relative search on the root node
      }
    }
    offset = (int) strlen( path_ ) + 1;
  }
  int len = (int) strlen( path_ );
  if ( len < offset-1 ) return 0;
  len -= offset;
  if ( ( len <= 0 ) || ( strncmp( path, path_+offset, len ) == 0 ) ) {
    if ( len > 0 && path[ len ] == 0 )
      return this;
    if ( len <= 0 || path[ len ] == '/' ) {
      for ( Node *nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->search( path, offset );
	if ( nn ) return nn;
      }
      return 0;
    }
  }
  return 0;
}